

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaForce.c
# Opt level: O1

Frc_Man_t * Frc_ManStartSimple(Gia_Man_t *pGia)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  Vec_Int_t *pVVar4;
  Gia_Obj_t *pGVar5;
  Gia_Obj_t *pGVar6;
  Frc_Man_t *pFVar7;
  Vec_Int_t *p;
  int *piVar8;
  Vec_Int_t *p_00;
  uint *puVar9;
  Vec_Int_t *pVVar10;
  ulong uVar11;
  int iVar12;
  int iVar13;
  uint uVar14;
  long lVar15;
  long lVar16;
  int local_64;
  
  Gia_ManCreateRefs(pGia);
  pFVar7 = (Frc_Man_t *)calloc(1,0x38);
  pFVar7->pGia = pGia;
  pFVar7->nRegs = pGia->nRegs;
  pVVar10 = pGia->vCis;
  iVar12 = pVVar10->nSize;
  p = (Vec_Int_t *)malloc(0x10);
  if (iVar12 - 1U < 0xf) {
    iVar12 = 0x10;
  }
  p->nSize = 0;
  p->nCap = iVar12;
  if (iVar12 == 0) {
    piVar8 = (int *)0x0;
  }
  else {
    piVar8 = (int *)malloc((long)iVar12 << 2);
  }
  p->pArray = piVar8;
  pFVar7->vCis = p;
  pVVar4 = pGia->vCos;
  iVar12 = pVVar4->nSize;
  p_00 = (Vec_Int_t *)malloc(0x10);
  iVar13 = 0x10;
  if (0xe < iVar12 - 1U) {
    iVar13 = iVar12;
  }
  p_00->nSize = 0;
  p_00->nCap = iVar13;
  if (iVar13 == 0) {
    piVar8 = (int *)0x0;
  }
  else {
    piVar8 = (int *)malloc((long)iVar13 << 2);
  }
  p_00->pArray = piVar8;
  pFVar7->vCos = p_00;
  iVar12 = pGia->nObjs;
  iVar13 = pVVar4->nSize;
  uVar3 = iVar12 * 10 + iVar13 * 2 + ~(pVVar10->nSize + iVar13) * 4;
  pFVar7->nObjData = uVar3;
  puVar9 = (uint *)calloc((long)(int)uVar3,4);
  pFVar7->pObjData = (int *)puVar9;
  pGia->pObjs->Value = 0;
  puVar9[3] = 0;
  *puVar9 = *puVar9 & 0xf;
  if (iVar12 < 1) {
LAB_00734ccc:
    __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                  ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
  }
  uVar14 = *pGia->pRefs;
  puVar9[1] = uVar14;
  pFVar7->nObjs = pFVar7->nObjs + 1;
  uVar14 = uVar14 + 6;
  pVVar10 = pGia->vCis;
  if (0 < pVVar10->nSize) {
    lVar15 = 0;
    do {
      iVar12 = pVVar10->pArray[lVar15];
      if (((long)iVar12 < 0) || (pGia->nObjs <= iVar12)) goto LAB_00734cad;
      if (pGia->pObjs == (Gia_Obj_t *)0x0) break;
      pGVar6 = pGia->pObjs + iVar12;
      pGVar6->Value = uVar14;
      Vec_IntPush(p,uVar14);
      puVar9[(long)(int)uVar14 + 3] = uVar14;
      uVar1 = puVar9[(int)uVar14];
      puVar9[(int)uVar14] = uVar1 & 0xf;
      pGVar5 = pGia->pObjs;
      if ((pGVar6 < pGVar5) || (pGVar5 + pGia->nObjs <= pGVar6)) goto LAB_00734ccc;
      uVar2 = pGia->pRefs[(int)((ulong)((long)pGVar6 - (long)pGVar5) >> 2) * -0x55555555];
      puVar9[(long)(int)uVar14 + 1] = uVar2;
      puVar9[(int)uVar14] = uVar1 & 0xe;
      uVar14 = uVar14 + uVar2 + 6;
      pFVar7->nObjs = pFVar7->nObjs + 1;
      lVar15 = lVar15 + 1;
      pVVar10 = pGia->vCis;
    } while (lVar15 < pVVar10->nSize);
  }
  uVar11 = (ulong)(uint)pGia->nObjs;
  if (pGia->nObjs < 1) {
    local_64 = 1;
  }
  else {
    local_64 = 1;
    lVar15 = 8;
    lVar16 = 0;
    do {
      pGVar6 = pGia->pObjs;
      if (pGVar6 == (Gia_Obj_t *)0x0) break;
      uVar1 = *(uint *)((long)pGVar6 + lVar15 + -8);
      if ((~uVar1 & 0x1fffffff) != 0 && -1 < (int)uVar1) {
        if ((int)uVar11 <= lVar16) goto LAB_00734ccc;
        piVar8 = pGia->pRefs;
        if (piVar8[lVar16] < 1) {
          __assert_fail("Gia_ObjRefNum( pGia, pObj ) > 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaForce.c"
                        ,0xc2,"Frc_Man_t *Frc_ManStartSimple(Gia_Man_t *)");
        }
        *(uint *)(&pGVar6->field_0x0 + lVar15) = uVar14;
        puVar9[(long)(int)uVar14 + 3] = uVar14;
        puVar9[(int)uVar14] = puVar9[(int)uVar14] & 0xf | 0x20;
        puVar9[(long)(int)uVar14 + 1] = piVar8[lVar16];
        Frc_ObjAddFanin((Frc_Obj_t *)(puVar9 + (int)uVar14),
                        (Frc_Obj_t *)
                        (puVar9 + *(int *)((long)pGVar6 +
                                          (ulong)((*(uint *)((long)pGVar6 + lVar15 + -8) &
                                                  0x1fffffff) << 2) * -3 + lVar15)));
        Frc_ObjAddFanin((Frc_Obj_t *)(puVar9 + (int)uVar14),
                        (Frc_Obj_t *)
                        (puVar9 + *(int *)((long)pGVar6 +
                                          (ulong)((*(uint *)((long)pGVar6 + lVar15 + -4) &
                                                  0x1fffffff) << 2) * -3 + lVar15)));
        uVar14 = puVar9[(long)(int)uVar14 + 1] + (puVar9[(int)uVar14] >> 4) + uVar14 + 6;
        local_64 = local_64 + 1;
        pFVar7->nObjs = pFVar7->nObjs + 1;
      }
      lVar16 = lVar16 + 1;
      uVar11 = (ulong)pGia->nObjs;
      lVar15 = lVar15 + 0xc;
    } while (lVar16 < (long)uVar11);
  }
  pVVar10 = pGia->vCos;
  if (0 < pVVar10->nSize) {
    lVar15 = 0;
    do {
      iVar12 = pVVar10->pArray[lVar15];
      if (((long)iVar12 < 0) || (pGia->nObjs <= iVar12)) {
LAB_00734cad:
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                      ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      if (pGia->pObjs == (Gia_Obj_t *)0x0) break;
      pGVar6 = pGia->pObjs + iVar12;
      pGVar6->Value = uVar14;
      Vec_IntPush(p_00,uVar14);
      puVar9[(long)(int)uVar14 + 3] = uVar14;
      uVar1 = puVar9[(int)uVar14];
      puVar9[(long)(int)uVar14 + 1] = 0;
      puVar9[(int)uVar14] = uVar1 & 0x1f | 0x12;
      Frc_ObjAddFanin((Frc_Obj_t *)(puVar9 + (int)uVar14),
                      (Frc_Obj_t *)
                      (puVar9 + (int)pGVar6[-(ulong)((uint)*(undefined8 *)pGVar6 & 0x1fffffff)].
                                     Value));
      uVar14 = puVar9[(long)(int)uVar14 + 1] + (puVar9[(int)uVar14] >> 4) + uVar14 + 6;
      pFVar7->nObjs = pFVar7->nObjs + 1;
      lVar15 = lVar15 + 1;
      pVVar10 = pGia->vCos;
    } while (lVar15 < pVVar10->nSize);
  }
  if (local_64 != pFVar7->nObjs - (p->nSize + p_00->nSize)) {
    __assert_fail("nNodes == Frc_ManNodeNum(p)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaForce.c"
                  ,0xe8,"Frc_Man_t *Frc_ManStartSimple(Gia_Man_t *)");
  }
  if (uVar14 != uVar3) {
    __assert_fail("hHandle == p->nObjData",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaForce.c"
                  ,0xe9,"Frc_Man_t *Frc_ManStartSimple(Gia_Man_t *)");
  }
  uVar3 = pGia->nObjs;
  if ((0 < (int)uVar3) && (pGVar6 = pGia->pObjs, pGVar6 != (Gia_Obj_t *)0x0)) {
    lVar15 = 0;
    do {
      lVar16 = (long)*(int *)((long)&pGVar6->Value + lVar15);
      if (lVar16 != -1) {
        if (puVar9[lVar16] >> 4 != puVar9[lVar16 + 5]) {
          __assert_fail("pObjLog->nFanins == pObjLog->iFanin",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaForce.c"
                        ,0xf2,"Frc_Man_t *Frc_ManStartSimple(Gia_Man_t *)");
        }
        if (puVar9[lVar16 + 1] != puVar9[lVar16 + 2]) {
          __assert_fail("pObjLog->nFanouts == pObjLog->iFanout",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaForce.c"
                        ,0xf3,"Frc_Man_t *Frc_ManStartSimple(Gia_Man_t *)");
        }
        puVar9[lVar16 + 2] = 0;
        puVar9[lVar16 + 5] = 0;
      }
      lVar15 = lVar15 + 0xc;
    } while ((ulong)uVar3 * 0xc != lVar15);
  }
  if (pGia->pRefs != (int *)0x0) {
    free(pGia->pRefs);
    pGia->pRefs = (int *)0x0;
  }
  return pFVar7;
}

Assistant:

Frc_Man_t * Frc_ManStartSimple( Gia_Man_t * pGia )
{
    Frc_Man_t * p;
    Frc_Obj_t * pObjLog, * pFanLog;
    Gia_Obj_t * pObj;//, * pObjRi, * pObjRo;
    int i, nNodes, hHandle = 0;
    // prepare the AIG
    Gia_ManCreateRefs( pGia );
    // create logic network
    p = ABC_CALLOC( Frc_Man_t, 1 );
    p->pGia  = pGia;
    p->nRegs = Gia_ManRegNum(pGia);
    p->vCis  = Vec_IntAlloc( Gia_ManCiNum(pGia) );
    p->vCos  = Vec_IntAlloc( Gia_ManCoNum(pGia) );
    p->nObjData = (sizeof(Frc_Obj_t) / 4) * Gia_ManObjNum(pGia) + 2 * (2 * Gia_ManAndNum(pGia) + Gia_ManCoNum(pGia));
    p->pObjData = ABC_CALLOC( int, p->nObjData );
    // create constant node
    Gia_ManConst0(pGia)->Value = hHandle;
    pObjLog = Frc_ManObj( p, hHandle );
    pObjLog->hHandle  = hHandle;
    pObjLog->nFanins  = 0;
    pObjLog->nFanouts = Gia_ObjRefNum( pGia, Gia_ManConst0(pGia) );
    // count objects
    hHandle += Frc_ObjSize( pObjLog );
    nNodes = 1;
    p->nObjs++;
    // create the PIs
    Gia_ManForEachCi( pGia, pObj, i )
    {
        // create PI object
        pObj->Value = hHandle;
        Vec_IntPush( p->vCis, hHandle );
        pObjLog = Frc_ManObj( p, hHandle );
        pObjLog->hHandle  = hHandle;
        pObjLog->nFanins  = 0;
        pObjLog->nFanouts = Gia_ObjRefNum( pGia, pObj );
        pObjLog->fCi = 0;
        // count objects
        hHandle += Frc_ObjSize( pObjLog );
        p->nObjs++;
    }
    // create internal nodes
    Gia_ManForEachAnd( pGia, pObj, i )
    {
        assert( Gia_ObjRefNum( pGia, pObj ) > 0 );
        // create node object
        pObj->Value = hHandle;
        pObjLog = Frc_ManObj( p, hHandle );
        pObjLog->hHandle  = hHandle;
        pObjLog->nFanins  = 2;
        pObjLog->nFanouts = Gia_ObjRefNum( pGia, pObj );
        // add fanins
        pFanLog = Frc_ManObj( p, Gia_ObjValue(Gia_ObjFanin0(pObj)) ); 
        Frc_ObjAddFanin( pObjLog, pFanLog );
        pFanLog = Frc_ManObj( p, Gia_ObjValue(Gia_ObjFanin1(pObj)) ); 
        Frc_ObjAddFanin( pObjLog, pFanLog );
        // count objects
        hHandle += Frc_ObjSize( pObjLog );
        nNodes++;
        p->nObjs++;
    }
    // create the POs
    Gia_ManForEachCo( pGia, pObj, i )
    {
        // create PO object
        pObj->Value = hHandle;
        Vec_IntPush( p->vCos, hHandle );
        pObjLog = Frc_ManObj( p, hHandle );
        pObjLog->hHandle  = hHandle;
        pObjLog->nFanins  = 1;
        pObjLog->nFanouts = 0;
        pObjLog->fCo = 1;
        // add fanins
        pFanLog = Frc_ManObj( p, Gia_ObjValue(Gia_ObjFanin0(pObj)) );
        Frc_ObjAddFanin( pObjLog, pFanLog );
        // count objects
        hHandle += Frc_ObjSize( pObjLog );
        p->nObjs++;
    }
    // connect registers
//    Gia_ManForEachRiRo( pGia, pObjRi, pObjRo, i )
//        Frc_ObjAddFanin( Frc_ManObj(p,Gia_ObjValue(pObjRo)), Frc_ManObj(p,Gia_ObjValue(pObjRi)) );
    assert( nNodes  == Frc_ManNodeNum(p) );
    assert( hHandle == p->nObjData );
    if ( hHandle != p->nObjData )
        printf( "Frc_ManStartSimple(): Fatal error in internal representation.\n" );
    // make sure the fanin/fanout counters are correct
    Gia_ManForEachObj( pGia, pObj, i )
    {
        if ( !~Gia_ObjValue(pObj) )
            continue;
        pObjLog = Frc_ManObj( p, Gia_ObjValue(pObj) );
        assert( pObjLog->nFanins  == pObjLog->iFanin );
        assert( pObjLog->nFanouts == pObjLog->iFanout );
        pObjLog->iFanin = pObjLog->iFanout = 0;
    }
    ABC_FREE( pGia->pRefs );
    return p;
}